

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O2

void __thiscall duckdb::LogicalSet::Serialize(LogicalSet *this,Serializer *serializer)

{
  LogicalOperator::Serialize(&this->super_LogicalOperator,serializer);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>(serializer,200,"name",&this->name);
  Serializer::WriteProperty<duckdb::Value>(serializer,0xc9,"value",&this->value);
  Serializer::WriteProperty<duckdb::SetScope>(serializer,0xca,"scope",&this->scope);
  return;
}

Assistant:

void LogicalSet::Serialize(Serializer &serializer) const {
	LogicalOperator::Serialize(serializer);
	serializer.WritePropertyWithDefault<string>(200, "name", name);
	serializer.WriteProperty<Value>(201, "value", value);
	serializer.WriteProperty<SetScope>(202, "scope", scope);
}